

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O1

void __thiscall QWizard::setPage(QWizard *this,int theid,QWizardPage *page)

{
  PageMap *this_00;
  QWizardPrivate *this_01;
  long lVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  add_const_t<QList<QWizardField>_> *__range1;
  QWizardField *field;
  QWizardField *field_00;
  long in_FS_OFFSET;
  QObject local_60 [8];
  QWidget *local_58;
  _Rb_tree_color local_50;
  _Rb_tree_color local_4c;
  void *local_48;
  _Rb_tree_color *p_Stack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &page->super_QWidget;
  local_50 = theid;
  if (page == (QWizardPage *)0x0) {
    setPage();
  }
  else if (theid == -1) {
    setPage();
  }
  else {
    this_01 = *(QWizardPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
    this_00 = &this_01->pageMap;
    bVar2 = QMap<int,_QWizardPage_*>::contains(this_00,(int *)&local_50);
    if (bVar2) {
      setPage((QWizard *)&local_50);
    }
    else {
      QWidget::setParent(local_58,&this_01->pageFrame->super_QWidget);
      lVar1 = *(long *)&local_58->field_0x8;
      if (*(long *)(lVar1 + 0x300) != 0) {
        field_00 = *(QWizardField **)(lVar1 + 0x2f8);
        lVar4 = *(long *)(lVar1 + 0x300) << 7;
        do {
          QWizardPrivate::addField(this_01,field_00);
          field_00 = field_00 + 1;
          lVar4 = lVar4 + -0x80;
        } while (lVar4 != 0);
      }
      QList<QWizardField>::clear((QList<QWizardField> *)(lVar1 + 0x2f0));
      QObject::connect(local_60,(char *)local_58,(QObject *)"2completeChanged()",(char *)this,
                       0x6f869f);
      QMetaObject::Connection::~Connection((Connection *)local_60);
      QMap<int,_QWizardPage_*>::insert(this_00,(int *)&local_50,(QWizardPage **)&local_58);
      *(QWizard **)(*(long *)&local_58->field_0x8 + 600) = this;
      iVar3 = (**(code **)(*(long *)&(this_01->pageVBoxLayout->super_QBoxLayout).super_QLayout + 200
                          ))();
      bVar2 = QLayout::isEnabled((QLayout *)this_01->pageVBoxLayout);
      QLayout::setEnabled((QLayout *)this_01->pageVBoxLayout,false);
      QBoxLayout::insertWidget
                (&this_01->pageVBoxLayout->super_QBoxLayout,iVar3 + -1,local_58,0,(Alignment)0x0);
      QWidget::hide(local_58);
      QLayout::setEnabled((QLayout *)this_01->pageVBoxLayout,bVar2);
      if ((this_01->startSetByUser == false) &&
         ((*(_Base_ptr *)
            ((long)&(((this_00->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10))
          [1]._M_color == local_50)) {
        this_01->start = local_50;
      }
      p_Stack_40 = &local_4c;
      local_4c = local_50;
      local_48 = (void *)0x0;
      QMetaObject::activate((QObject *)this,&staticMetaObject,3,&local_48);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizard::setPage(int theid, QWizardPage *page)
{
    Q_D(QWizard);

    if (Q_UNLIKELY(!page)) {
        qWarning("QWizard::setPage: Cannot insert null page");
        return;
    }

    if (Q_UNLIKELY(theid == -1)) {
        qWarning("QWizard::setPage: Cannot insert page with ID -1");
        return;
    }

    if (Q_UNLIKELY(d->pageMap.contains(theid))) {
        qWarning("QWizard::setPage: Page with duplicate ID %d ignored", theid);
        return;
    }

    page->setParent(d->pageFrame);

    QList<QWizardField> &pendingFields = page->d_func()->pendingFields;
    for (const auto &field : std::as_const(pendingFields))
        d->addField(field);
    pendingFields.clear();

    connect(page, SIGNAL(completeChanged()), this, SLOT(_q_updateButtonStates()));

    d->pageMap.insert(theid, page);
    page->d_func()->wizard = this;

    int n = d->pageVBoxLayout->count();

    // disable layout to prevent layout updates while adding
    bool pageVBoxLayoutEnabled = d->pageVBoxLayout->isEnabled();
    d->pageVBoxLayout->setEnabled(false);

    d->pageVBoxLayout->insertWidget(n - 1, page);

    // hide new page and reset layout to old status
    page->hide();
    d->pageVBoxLayout->setEnabled(pageVBoxLayoutEnabled);

    if (!d->startSetByUser && d->pageMap.constBegin().key() == theid)
        d->start = theid;
    emit pageAdded(theid);
}